

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

uint __thiscall
fmt::internal::ArgVisitor<fmt::(anonymous_namespace)::WidthHandler,_unsigned_int>::visit
          (ArgVisitor<fmt::(anonymous_namespace)::WidthHandler,_unsigned_int> *this,Arg *arg)

{
  Arg *arg_local;
  ArgVisitor<fmt::(anonymous_namespace)::WidthHandler,_unsigned_int> *this_local;
  
  switch(arg->type) {
  case INT:
    this_local._4_4_ = visit_int(this,(arg->super_Value).field_0.int_value);
    break;
  case UINT:
    this_local._4_4_ = visit_uint(this,(arg->super_Value).field_0.uint_value);
    break;
  case LONG_LONG:
    this_local._4_4_ = visit_long_long(this,(arg->super_Value).field_0.long_long_value);
    break;
  case ULONG_LONG:
    this_local._4_4_ = visit_ulong_long(this,(arg->super_Value).field_0.ulong_long_value);
    break;
  case BOOL:
    this_local._4_4_ = visit_bool(this,(arg->super_Value).field_0.int_value != 0);
    break;
  case CHAR:
    this_local._4_4_ = visit_char(this,(arg->super_Value).field_0.int_value);
    break;
  case DOUBLE:
    this_local._4_4_ = visit_double(this,(arg->super_Value).field_0.double_value);
    break;
  case LAST_NUMERIC_TYPE:
    this_local._4_4_ = visit_long_double(this,(arg->super_Value).field_0.long_double_value);
    break;
  case CSTRING:
    this_local._4_4_ = visit_cstring(this,(arg->super_Value).field_0.string.value);
    break;
  case STRING:
    this_local._4_4_ = visit_string(this,(arg->super_Value).field_0.string);
    break;
  case WSTRING:
    this_local._4_4_ = visit_wstring(this,(arg->super_Value).field_0.wstring);
    break;
  case POINTER:
    this_local._4_4_ = visit_pointer(this,(arg->super_Value).field_0.pointer);
    break;
  case CUSTOM:
    this_local._4_4_ = visit_custom(this,(arg->super_Value).field_0.custom);
    break;
  default:
    __assert_fail("(false) && \"invalid argument type\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/AndroidModLoader[P]gta3sc/deps/cppformat/cppformat/format.h"
                  ,0x4f9,
                  "Result fmt::internal::ArgVisitor<fmt::(anonymous namespace)::WidthHandler, unsigned int>::visit(const Arg &) [Impl = fmt::(anonymous namespace)::WidthHandler, Result = unsigned int]"
                 );
  }
  return this_local._4_4_;
}

Assistant:

Result visit(const Arg &arg) {
    switch (arg.type) {
    default:
      FMT_ASSERT(false, "invalid argument type");
      return Result();
    case Arg::INT:
      return FMT_DISPATCH(visit_int(arg.int_value));
    case Arg::UINT:
      return FMT_DISPATCH(visit_uint(arg.uint_value));
    case Arg::LONG_LONG:
      return FMT_DISPATCH(visit_long_long(arg.long_long_value));
    case Arg::ULONG_LONG:
      return FMT_DISPATCH(visit_ulong_long(arg.ulong_long_value));
    case Arg::BOOL:
      return FMT_DISPATCH(visit_bool(arg.int_value != 0));
    case Arg::CHAR:
      return FMT_DISPATCH(visit_char(arg.int_value));
    case Arg::DOUBLE:
      return FMT_DISPATCH(visit_double(arg.double_value));
    case Arg::LONG_DOUBLE:
      return FMT_DISPATCH(visit_long_double(arg.long_double_value));
    case Arg::CSTRING:
      return FMT_DISPATCH(visit_cstring(arg.string.value));
    case Arg::STRING:
      return FMT_DISPATCH(visit_string(arg.string));
    case Arg::WSTRING:
      return FMT_DISPATCH(visit_wstring(arg.wstring));
    case Arg::POINTER:
      return FMT_DISPATCH(visit_pointer(arg.pointer));
    case Arg::CUSTOM:
      return FMT_DISPATCH(visit_custom(arg.custom));
    }
  }